

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O3

void __thiscall OpenMD::Thermo::getComAll(Thermo *this,Vector3d *com,Vector3d *comVel)

{
  SimInfo *this_00;
  uint i_1;
  Molecule *this_01;
  long lVar1;
  Snapshot *this_02;
  MoleculeIterator i;
  double local_80;
  Vector3d local_78;
  double local_60;
  Snapshot *local_58;
  MoleculeIterator local_50;
  Vector3d local_48;
  
  this_00 = this->info_;
  this_02 = this_00->sman_->currentSnapshot_;
  if ((this_02->hasCOM != true) || (this_02->hasCOMvel == false)) {
    local_50._M_node = (_Base_ptr)0x0;
    (com->super_Vector<double,_3U>).data_[2] = 0.0;
    (com->super_Vector<double,_3U>).data_[0] = 0.0;
    (com->super_Vector<double,_3U>).data_[1] = 0.0;
    (comVel->super_Vector<double,_3U>).data_[2] = 0.0;
    (comVel->super_Vector<double,_3U>).data_[0] = 0.0;
    (comVel->super_Vector<double,_3U>).data_[1] = 0.0;
    local_58 = this_02;
    this_01 = SimInfo::beginMolecule(this_00,&local_50);
    if (this_01 == (Molecule *)0x0) {
      local_80 = 0.0;
    }
    else {
      local_80 = 0.0;
      do {
        local_60 = Molecule::getMass(this_01);
        Molecule::getCom(&local_48,this_01);
        local_78.super_Vector<double,_3U>.data_[0] = 0.0;
        local_78.super_Vector<double,_3U>.data_[1] = 0.0;
        local_78.super_Vector<double,_3U>.data_[2] = 0.0;
        lVar1 = 0;
        do {
          local_78.super_Vector<double,_3U>.data_[lVar1] =
               local_48.super_Vector<double,_3U>.data_[lVar1] * local_60;
          lVar1 = lVar1 + 1;
        } while (lVar1 != 3);
        lVar1 = 0;
        do {
          (com->super_Vector<double,_3U>).data_[lVar1] =
               local_78.super_Vector<double,_3U>.data_[lVar1] +
               (com->super_Vector<double,_3U>).data_[lVar1];
          lVar1 = lVar1 + 1;
        } while (lVar1 != 3);
        Molecule::getComVel(&local_48,this_01);
        local_78.super_Vector<double,_3U>.data_[0] = 0.0;
        local_78.super_Vector<double,_3U>.data_[1] = 0.0;
        local_78.super_Vector<double,_3U>.data_[2] = 0.0;
        lVar1 = 0;
        do {
          local_78.super_Vector<double,_3U>.data_[lVar1] =
               local_48.super_Vector<double,_3U>.data_[lVar1] * local_60;
          lVar1 = lVar1 + 1;
        } while (lVar1 != 3);
        lVar1 = 0;
        do {
          (comVel->super_Vector<double,_3U>).data_[lVar1] =
               local_78.super_Vector<double,_3U>.data_[lVar1] +
               (comVel->super_Vector<double,_3U>).data_[lVar1];
          lVar1 = lVar1 + 1;
        } while (lVar1 != 3);
        local_80 = local_80 + local_60;
        this_01 = SimInfo::nextMolecule(this->info_,&local_50);
      } while (this_01 != (Molecule *)0x0);
    }
    this_02 = local_58;
    lVar1 = 0;
    do {
      (com->super_Vector<double,_3U>).data_[lVar1] =
           (com->super_Vector<double,_3U>).data_[lVar1] / local_80;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    lVar1 = 0;
    do {
      (comVel->super_Vector<double,_3U>).data_[lVar1] =
           (comVel->super_Vector<double,_3U>).data_[lVar1] / local_80;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    Snapshot::setCOM(local_58,com);
    Snapshot::setCOMvel(this_02,comVel);
  }
  Snapshot::getCOM(&local_78,this_02);
  if (&local_78 != com) {
    (com->super_Vector<double,_3U>).data_[2] = local_78.super_Vector<double,_3U>.data_[2];
    (com->super_Vector<double,_3U>).data_[0] = local_78.super_Vector<double,_3U>.data_[0];
    (com->super_Vector<double,_3U>).data_[1] = local_78.super_Vector<double,_3U>.data_[1];
  }
  Snapshot::getCOMvel(&local_78,this_02);
  if (&local_78 != comVel) {
    (comVel->super_Vector<double,_3U>).data_[2] = local_78.super_Vector<double,_3U>.data_[2];
    (comVel->super_Vector<double,_3U>).data_[0] = local_78.super_Vector<double,_3U>.data_[0];
    (comVel->super_Vector<double,_3U>).data_[1] = local_78.super_Vector<double,_3U>.data_[1];
  }
  return;
}

Assistant:

void Thermo::getComAll(Vector3d& com, Vector3d& comVel) {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!(snap->hasCOM && snap->hasCOMvel)) {
      SimInfo::MoleculeIterator i;
      Molecule* mol;

      RealType totalMass(0.0);

      com    = 0.0;
      comVel = 0.0;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        RealType mass = mol->getMass();
        totalMass += mass;
        com += mass * mol->getCom();
        comVel += mass * mol->getComVel();
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &totalMass, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, com.getArrayPointer(), 3, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, comVel.getArrayPointer(), 3, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
#endif

      com /= totalMass;
      comVel /= totalMass;
      snap->setCOM(com);
      snap->setCOMvel(comVel);
    }
    com    = snap->getCOM();
    comVel = snap->getCOMvel();
    return;
  }